

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void UA_Client_Subscriptions_forceDelete(UA_Client *client,UA_Client_Subscription *sub)

{
  UA_Client_MonitoredItem *pUVar1;
  UA_Client_MonitoredItem *pUVar2;
  UA_Client_MonitoredItem **ppUVar3;
  UA_Client_Subscription *pUVar4;
  UA_Client_Subscription **ppUVar5;
  UA_Client_MonitoredItem *__ptr;
  
  __ptr = (sub->monitoredItems).lh_first;
  while (__ptr != (UA_Client_MonitoredItem *)0x0) {
    pUVar1 = (__ptr->listEntry).le_next;
    deleteMembers_noInit(&__ptr->monitoredNodeId,UA_TYPES + 0x10);
    pUVar2 = (__ptr->listEntry).le_next;
    ppUVar3 = (__ptr->listEntry).le_prev;
    if (pUVar2 != (UA_Client_MonitoredItem *)0x0) {
      (pUVar2->listEntry).le_prev = ppUVar3;
    }
    *ppUVar3 = pUVar2;
    free(__ptr);
    __ptr = pUVar1;
  }
  pUVar4 = (sub->listEntry).le_next;
  ppUVar5 = (sub->listEntry).le_prev;
  if (pUVar4 != (UA_Client_Subscription *)0x0) {
    (pUVar4->listEntry).le_prev = ppUVar5;
  }
  *ppUVar5 = pUVar4;
  free(sub);
  return;
}

Assistant:

void
UA_Client_Subscriptions_forceDelete(UA_Client *client,
                                    UA_Client_Subscription *sub) {
    UA_Client_MonitoredItem *mon, *mon_tmp;
    LIST_FOREACH_SAFE(mon, &sub->monitoredItems, listEntry, mon_tmp) {
        UA_NodeId_deleteMembers(&mon->monitoredNodeId);
        LIST_REMOVE(mon, listEntry);
        UA_free(mon);
    }
    LIST_REMOVE(sub, listEntry);
    UA_free(sub);
}